

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclBufSize.c
# Opt level: O3

void Abc_SclBufSize(Bus_Man_t *p,float Gain)

{
  Abc_Obj_t *pAVar1;
  Vec_Int_t *pVVar2;
  void *pvVar3;
  bool bVar4;
  int iVar5;
  Abc_Obj_t *pObj;
  SC_Cell *pSVar6;
  SC_BusPars *pSVar7;
  Abc_Ntk_t *pAVar8;
  Vec_Ptr_t *pVVar9;
  uint uVar10;
  int iVar11;
  char *__function;
  uint uVar12;
  long lVar13;
  int iVar14;
  long lVar15;
  char *__file;
  Bus_Man_t *p_00;
  SC_Cell *pSVar16;
  SC_Timing *pSVar17;
  float fVar18;
  float fVar19;
  double dVar20;
  SC_Pair ArrOut1;
  SC_Pair ArrOut0;
  timespec ts;
  SC_Pair ArrIn;
  SC_Pair LoadIn;
  SC_Pair SlewIn;
  float local_94;
  SC_Pair local_88;
  SC_Pair local_80;
  timespec local_78;
  int local_64;
  long local_60;
  SC_Pair local_58;
  SC_Pair local_50;
  SC_Pair local_48;
  SC_Pair local_40;
  SC_Pair local_38;
  
  iVar5 = clock_gettime(3,&local_78);
  if (iVar5 < 0) {
    local_60 = 1;
  }
  else {
    lVar13 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_78.tv_nsec),8);
    local_60 = ((lVar13 >> 7) - (lVar13 >> 0x3f)) + local_78.tv_sec * -1000000;
  }
  pAVar8 = p->pNtk;
  iVar5 = pAVar8->vObjs->nSize;
  local_94 = Gain;
  if (p->pPars->fAddBufs != 0) {
    local_94 = Gain * Gain;
  }
  if (0 < (long)iVar5) {
    iVar14 = iVar5 * 2;
    lVar13 = (long)iVar5;
    local_64 = iVar14;
    do {
      pVVar9 = p->pNtk->vObjs;
      iVar11 = pVVar9->nSize;
      if (iVar11 < lVar13) goto LAB_0045a0e5;
      pAVar1 = (Abc_Obj_t *)pVVar9->pArray[lVar13 + -1];
      if (pAVar1 != (Abc_Obj_t *)0x0) {
        uVar10 = *(uint *)&pAVar1->field_0x14 & 0xf;
        if ((uVar10 == 2) || (uVar10 == 5)) {
          if (p->pPiDrive != (SC_Cell *)0x0) goto LAB_00459a35;
        }
        else if ((uVar10 == 7) && (0 < (pAVar1->vFanins).nSize)) {
LAB_00459a35:
          if (iVar14 < iVar11) {
            printf("Buffering could not be completed because the gain value (%d) is too low.\n",
                   (ulong)(uint)p->pPars->GainRatio);
            dVar20 = 0.0;
            goto LAB_0045a020;
          }
          Abc_NtkComputeFanoutInfo(pAVar1,(float)p->pPars->Slew);
          fVar18 = Abc_NtkComputeNodeLoad(p,pAVar1);
          uVar10 = *(uint *)&pAVar1->field_0x14 & 0xf;
          if (((uVar10 == 2) || (uVar10 == 5)) ||
             ((pAVar8 = pAVar1->pNtk, uVar10 == 7 &&
              (((pAVar8->ntkFunc == ABC_FUNC_MAP && ((pAVar1->vFanins).nSize == 1)) &&
               ((pAVar1->field_5).pData == (void *)0x0)))))) {
            pSVar16 = p->pPiDrive;
            if (pSVar16 != (SC_Cell *)0x0) {
              iVar11 = pSVar16->n_inputs;
              if ((long)iVar11 < 1) goto LAB_00459bbb;
              uVar12 = (pSVar16->vPins).nSize;
              if ((int)uVar12 < 1) {
                uVar12 = 0;
              }
              if (iVar11 - 1U < uVar12) {
                fVar19 = 0.0;
                lVar15 = 0;
                do {
                  pvVar3 = (pSVar16->vPins).pArray[lVar15];
                  fVar19 = fVar19 + *(float *)((long)pvVar3 + 0x10) * 0.5 +
                                    *(float *)((long)pvVar3 + 0x14) * 0.5;
                  lVar15 = lVar15 + 1;
                } while (iVar11 != lVar15);
                goto LAB_00459bbe;
              }
              goto LAB_0045a0e5;
            }
            pSVar16 = (SC_Cell *)0x0;
            fVar19 = fVar18;
          }
          else {
            iVar11 = pAVar1->Id;
            if (((long)iVar11 < 0) || (pAVar8->vGates->nSize <= iVar11)) {
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                            ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
            }
            iVar11 = pAVar8->vGates->pArray[iVar11];
            if (((long)iVar11 < 0) || (*(int *)((long)pAVar8->pSCLib + 100) <= iVar11))
            goto LAB_0045a0e5;
            pSVar16 = *(SC_Cell **)(*(long *)((long)pAVar8->pSCLib + 0x68) + (long)iVar11 * 8);
            pSVar6 = pSVar16->pAve;
            iVar11 = pSVar6->n_inputs;
            if ((long)iVar11 < 1) {
LAB_00459bbb:
              fVar19 = 0.0;
            }
            else {
              uVar12 = (pSVar6->vPins).nSize;
              if ((int)uVar12 < 1) {
                uVar12 = 0;
              }
              if (uVar12 <= iVar11 - 1U) goto LAB_0045a0e5;
              fVar19 = 0.0;
              lVar15 = 0;
              do {
                pvVar3 = (pSVar6->vPins).pArray[lVar15];
                fVar19 = fVar19 + *(float *)((long)pvVar3 + 0x10) * 0.5 +
                                  *(float *)((long)pvVar3 + 0x14) * 0.5;
                lVar15 = lVar15 + 1;
              } while (iVar11 != lVar15);
            }
LAB_00459bbe:
            if (iVar11 < 2) {
              iVar11 = 1;
            }
            fVar19 = fVar19 / (float)iVar11;
          }
          if ((p->pPars->fSizeOnly == 0) &&
             ((p->pPars->nDegree < (pAVar1->vFanouts).nSize || (fVar19 * local_94 < fVar18)))) {
            Abc_NodeCollectFanouts(pAVar1,p->vFanouts);
            pVVar9 = p->vFanouts;
            if (1 < (long)pVVar9->nSize) {
              qsort(pVVar9->pArray,(long)pVVar9->nSize,8,Bus_SclCompareFanouts);
              pVVar9 = p->vFanouts;
            }
            pSVar7 = p->pPars;
            do {
              if (pSVar7->fVeryVerbose != 0) {
                Abc_NtkPrintFanoutProfileVec(pAVar1,pVVar9);
                pVVar9 = p->vFanouts;
              }
              p_00 = p;
              pObj = Abc_SclAddOneInv(p,pAVar1,pVVar9,local_94);
              if (p->pPars->fVeryVerbose != 0) {
                Abc_SclOneNodePrint(p_00,pObj);
              }
              Bus_SclInsertFanout(p->vFanouts,pObj);
              fVar18 = Abc_NtkComputeFanoutLoad(p,p->vFanouts);
              pSVar7 = p->pPars;
              pVVar9 = p->vFanouts;
              iVar14 = pVVar9->nSize;
            } while ((pSVar7->nDegree < iVar14) || ((1 < iVar14 && (fVar19 * local_94 < fVar18))));
            if (0 < iVar14) {
              lVar15 = 0;
              do {
                if ((((Abc_Obj_t *)pVVar9->pArray[lVar15])->vFanins).nSize == 0) {
                  Abc_ObjAddFanin((Abc_Obj_t *)pVVar9->pArray[lVar15],pAVar1);
                  pVVar9 = p->vFanouts;
                }
                lVar15 = lVar15 + 1;
              } while (lVar15 < pVVar9->nSize);
            }
            iVar14 = pAVar1->Id;
            if (((long)iVar14 < 0) ||
               (lVar15 = *(long *)((long)pAVar1->pNtk->pBSMan + 0x48),
               *(int *)(lVar15 + 4) <= iVar14)) {
              __file = 
              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecFlt.h"
              ;
              __function = "void Vec_FltWriteEntry(Vec_Flt_t *, int, float)";
              goto LAB_0045a0fa;
            }
            *(undefined4 *)(*(long *)(lVar15 + 8) + (long)iVar14 * 4) = 0;
            fVar19 = Abc_NtkComputeNodeLoad(p,pAVar1);
            if ((1.0 <= fVar19 - fVar18) || (1.0 <= fVar18 - fVar19)) {
              __assert_fail("LoadNew - Load < 1 && Load - LoadNew < 1",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/scl/sclBufSize.c"
                            ,0x1c9,"void Abc_SclBufSize(Bus_Man_t *, float)");
            }
            uVar10 = *(uint *)&pAVar1->field_0x14 & 0xf;
            iVar14 = local_64;
          }
          if (((uVar10 != 2) && (uVar10 != 5)) &&
             ((Abc_NtkComputeNodeDeparture(pAVar1,(float)p->pPars->Slew),
              pAVar1->pNtk->ntkFunc != ABC_FUNC_MAP ||
              ((((*(uint *)&pAVar1->field_0x14 & 0xf) != 7 || ((pAVar1->vFanins).nSize != 1)) ||
               ((pAVar1->field_5).pData != (void *)0x0)))))) {
            pSVar6 = Abc_SclFindSmallestGate(pSVar16,fVar18 / local_94);
            iVar11 = pAVar1->Id;
            if (((long)iVar11 < 0) || (pVVar2 = pAVar1->pNtk->vGates, pVVar2->nSize <= iVar11)) {
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                            ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
            }
            pVVar2->pArray[iVar11] = pSVar6->Id;
            pSVar7 = p->pPars;
            if (pSVar7->fVeryVerbose != 0) {
              Abc_SclOneNodePrint((Bus_Man_t *)pSVar16,pAVar1);
              pSVar7 = p->pPars;
            }
            if ((pSVar7->fSizeOnly == 0) && (pSVar7->nDegree < (pAVar1->vFanouts).nSize)) {
              __assert_fail("p->pPars->fSizeOnly || Abc_ObjFanoutNum(pObj) <= p->pPars->nDegree",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/scl/sclBufSize.c"
                            ,0x1d5,"void Abc_SclBufSize(Bus_Man_t *, float)");
            }
          }
        }
      }
      bVar4 = 1 < lVar13;
      lVar13 = lVar13 + -1;
    } while (bVar4);
    pAVar8 = p->pNtk;
  }
  pVVar9 = pAVar8->vCis;
  if (pVVar9->nSize < 1) {
    dVar20 = 0.0;
  }
  else {
    fVar18 = 0.0;
    lVar13 = 0;
    do {
      pAVar1 = (Abc_Obj_t *)pVVar9->pArray[lVar13];
      fVar19 = Abc_NtkComputeNodeDeparture(pAVar1,(float)p->pPars->Slew);
      pSVar16 = p->pPiDrive;
      if (pSVar16 != (SC_Cell *)0x0) {
        iVar14 = pAVar1->Id;
        if (((long)iVar14 < 0) ||
           (lVar15 = *(long *)((long)pAVar1->pNtk->pBSMan + 0x48), *(int *)(lVar15 + 4) <= iVar14))
        {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecFlt.h"
                        ,0x16e,"float Vec_FltEntry(Vec_Flt_t *, int)");
        }
        local_50.rise = *(float *)(*(long *)(lVar15 + 8) + (long)iVar14 * 4);
        local_78.tv_sec = 0;
        local_58.rise = 0.0;
        local_58.fall = 0.0;
        local_38.rise = 0.0;
        local_38.fall = 0.0;
        local_80.rise = 0.0;
        local_80.fall = 0.0;
        local_88.rise = 0.0;
        local_88.fall = 0.0;
        local_40.rise = 0.0;
        local_40.fall = 0.0;
        local_48.rise = 0.0;
        local_48.fall = 0.0;
        local_50.fall = local_50.rise;
        if (pSVar16->n_inputs != 1) {
          __assert_fail("pCell->n_inputs == 1",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/scl/sclLib.h"
                        ,0x2af,
                        "void Scl_LibHandleInputDriver(SC_Cell *, SC_Pair *, SC_Pair *, SC_Pair *)")
          ;
        }
        if ((pSVar16->vPins).nSize < 2) {
LAB_0045a0e5:
          __file = 
          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
          ;
          __function = "void *Vec_PtrEntry(Vec_Ptr_t *, int)";
LAB_0045a0fa:
          __assert_fail("i >= 0 && i < p->nSize",__file,0x184,__function);
        }
        pvVar3 = (pSVar16->vPins).pArray[1];
        if (*(int *)((long)pvVar3 + 0x44) != 1) {
LAB_0045a104:
          __assert_fail("Vec_PtrSize(&pPin->vRTimings) == pCell->n_inputs",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/scl/sclLib.h"
                        ,0x292,"SC_Timing *Scl_CellPinTime(SC_Cell *, int)");
        }
        lVar15 = **(long **)((long)pvVar3 + 0x48);
        iVar14 = *(int *)(lVar15 + 0xc);
        if (iVar14 == 0) {
          pSVar17 = (SC_Timing *)0x0;
        }
        else {
          if (iVar14 != 1) goto LAB_0045a180;
          pSVar17 = (SC_Timing *)**(undefined8 **)(lVar15 + 0x10);
        }
        Scl_LibPinArrival(pSVar17,&local_58,&local_38,(SC_Pair *)&local_78,&local_80,&local_40);
        iVar14 = pSVar16->n_inputs;
        if ((long)iVar14 < 1) {
          __assert_fail("iPin >= 0 && iPin < pCell->n_inputs",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/scl/sclLib.h"
                        ,0x290,"SC_Timing *Scl_CellPinTime(SC_Cell *, int)");
        }
        if ((pSVar16->vPins).nSize <= iVar14) goto LAB_0045a0e5;
        pvVar3 = (pSVar16->vPins).pArray[iVar14];
        if (*(int *)((long)pvVar3 + 0x44) != iVar14) goto LAB_0045a104;
        lVar15 = **(long **)((long)pvVar3 + 0x48);
        iVar14 = *(int *)(lVar15 + 0xc);
        if (iVar14 == 0) {
          pSVar17 = (SC_Timing *)0x0;
        }
        else {
          if (iVar14 != 1) {
LAB_0045a180:
            __assert_fail("Vec_PtrSize(&pRTime->vTimings) == 1",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/scl/sclLib.h"
                          ,0x296,"SC_Timing *Scl_CellPinTime(SC_Cell *, int)");
          }
          pSVar17 = (SC_Timing *)**(undefined8 **)(lVar15 + 0x10);
        }
        Scl_LibPinArrival(pSVar17,&local_58,&local_38,&local_50,&local_88,&local_48);
        fVar19 = fVar19 + (local_88.fall - local_80.fall) * 0.5 +
                          (local_88.rise - local_80.rise) * 0.5;
      }
      if (fVar18 <= fVar19) {
        fVar18 = fVar19;
      }
      lVar13 = lVar13 + 1;
      pVVar9 = p->pNtk->vCis;
    } while (lVar13 < pVVar9->nSize);
    dVar20 = (double)fVar18;
  }
LAB_0045a020:
  pSVar7 = p->pPars;
  if (pSVar7->fVerbose != 0) {
    printf("WireLoads = %d  Degree = %d  Target slew =%4d ps   Gain2 =%5d  Buf = %6d  Delay =%7.0f ps   "
           ,dVar20,(ulong)(uint)pSVar7->fUseWireLoads,(ulong)(uint)pSVar7->nDegree,
           (ulong)(uint)pSVar7->Slew,(ulong)(uint)pSVar7->GainRatio,
           (ulong)(uint)(p->pNtk->vObjs->nSize - iVar5));
    iVar14 = 3;
    iVar5 = clock_gettime(3,&local_78);
    if (iVar5 < 0) {
      lVar13 = -1;
    }
    else {
      lVar13 = local_78.tv_nsec / 1000 + local_78.tv_sec * 1000000;
    }
    lVar13 = lVar13 + local_60;
    Abc_Print(iVar14,"%s =","Time");
    Abc_Print(iVar14,"%9.2f sec\n",(double)lVar13 / 1000000.0);
  }
  return;
}

Assistant:

void Abc_SclBufSize( Bus_Man_t * p, float Gain )
{
    SC_Cell * pCell, * pCellNew;
    Abc_Obj_t * pObj, * pFanout;
    abctime clk = Abc_Clock();
    int i, k, nObjsOld = Abc_NtkObjNumMax(p->pNtk);
    float GainGate, GainInv, Load, LoadNew, Cin, DeptMax = 0;
    GainGate = p->pPars->fAddBufs ? (float)pow( (double)Gain, (double)2.0 ) : Gain;
    GainInv  = p->pPars->fAddBufs ? (float)pow( (double)Gain, (double)2.0 ) : Gain;
    Abc_NtkForEachObjReverse( p->pNtk, pObj, i )
    {
        if ( !((Abc_ObjIsNode(pObj) && Abc_ObjFaninNum(pObj) > 0) || (Abc_ObjIsCi(pObj) && p->pPiDrive)) )
            continue;
        if ( 2 * nObjsOld < Abc_NtkObjNumMax(p->pNtk) )
        {
            printf( "Buffering could not be completed because the gain value (%d) is too low.\n", p->pPars->GainRatio );
            break;
        }
        // compute load
        Abc_NtkComputeFanoutInfo( pObj, p->pPars->Slew );
        Load = Abc_NtkComputeNodeLoad( p, pObj );
        // consider the gate
        if ( Abc_ObjIsCi(pObj) || Abc_ObjIsBarBuf(pObj) )
        {
            pCell = p->pPiDrive;
            // if PI driver is not given, assume Cin to be equal to Load
            // this way, buffering of the PIs is performed
            Cin = pCell ? SC_CellPinCapAve(pCell) : Load;
        }
        else
        {
            pCell = Abc_SclObjCell( pObj );
            Cin = SC_CellPinCapAve( pCell->pAve );
//        Cin = SC_CellPinCapAve( pCell->pRepr->pNext );
        }
        // consider buffering this gate
        if ( !p->pPars->fSizeOnly && (Abc_ObjFanoutNum(pObj) > p->pPars->nDegree || Load > GainGate * Cin) )
        {
            // add one or more inverters
//            Abc_NtkPrintFanoutProfile( pObj );
            Abc_NodeCollectFanouts( pObj, p->vFanouts );
            Vec_PtrSort( p->vFanouts, (int(*)(void))Bus_SclCompareFanouts );
            do 
            {
                Abc_Obj_t * pInv;
                if ( p->pPars->fVeryVerbose )//|| Vec_PtrSize(p->vFanouts) == Abc_ObjFanoutNum(pObj) )
                    Abc_NtkPrintFanoutProfileVec( pObj, p->vFanouts );
                pInv = Abc_SclAddOneInv( p, pObj, p->vFanouts, GainInv );
                if ( p->pPars->fVeryVerbose )
                    Abc_SclOneNodePrint( p, pInv );
                Bus_SclInsertFanout( p->vFanouts, pInv );
                Load = Abc_NtkComputeFanoutLoad( p, p->vFanouts );
            }
            while ( Vec_PtrSize(p->vFanouts) > p->pPars->nDegree || (Vec_PtrSize(p->vFanouts) > 1 && Load > GainGate * Cin) );
            // update node fanouts
            Vec_PtrForEachEntry( Abc_Obj_t *, p->vFanouts, pFanout, k )
                if ( Abc_ObjFaninNum(pFanout) == 0 )
                    Abc_ObjAddFanin( pFanout, pObj );
            Bus_SclObjSetLoad( pObj, 0 );
            LoadNew = Abc_NtkComputeNodeLoad( p, pObj );
            assert( LoadNew - Load < 1 && Load - LoadNew < 1 );
        } 
        if ( Abc_ObjIsCi(pObj) )
            continue;
        Abc_NtkComputeNodeDeparture( pObj, p->pPars->Slew );
        if ( Abc_ObjIsBarBuf(pObj) )
            continue;
        // create cell
        pCellNew = Abc_SclFindSmallestGate( pCell, Load / GainGate );
        Abc_SclObjSetCell( pObj, pCellNew );
        if ( p->pPars->fVeryVerbose )
            Abc_SclOneNodePrint( p, pObj );
        assert( p->pPars->fSizeOnly || Abc_ObjFanoutNum(pObj) <= p->pPars->nDegree );
    }
    // compute departure time of the PI
    if ( i < 0 ) // finished buffering
    Abc_NtkForEachCi( p->pNtk, pObj, i )
    {
        float DeptCur = Abc_NtkComputeNodeDeparture(pObj, p->pPars->Slew);
        if ( p->pPiDrive )
        {
            float Load = Bus_SclObjLoad( pObj );
            SC_Pair ArrOut, SlewOut, LoadIn = { Load, Load }; 
            Scl_LibHandleInputDriver( p->pPiDrive, &LoadIn, &ArrOut, &SlewOut );
            DeptCur += 0.5 * ArrOut.fall +  0.5 * ArrOut.rise;
        }       
        DeptMax = Abc_MaxFloat( DeptMax, DeptCur );
    }
    if ( p->pPars->fVerbose )
    {
        printf( "WireLoads = %d  Degree = %d  Target slew =%4d ps   Gain2 =%5d  Buf = %6d  Delay =%7.0f ps   ", 
            p->pPars->fUseWireLoads, p->pPars->nDegree, p->pPars->Slew, p->pPars->GainRatio, 
            Abc_NtkObjNumMax(p->pNtk) - nObjsOld, DeptMax );
        Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
    }
}